

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

Dim * __thiscall
cnn::Concatenate::dim_forward
          (Dim *__return_storage_ptr__,Concatenate *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  pointer pDVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  invalid_argument *this_00;
  uint uVar10;
  pointer pDVar11;
  Dim c;
  ostringstream s;
  size_t local_210;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  uint local_1d8;
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  pDVar11 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar3 = *(undefined8 *)(pDVar11->d + 2);
  uVar4 = *(undefined8 *)(pDVar11->d + 4);
  uVar5 = *(undefined8 *)(pDVar11->d + 6);
  *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)pDVar11->d;
  *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar3;
  *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar4;
  *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar5;
  __return_storage_ptr__->bd = pDVar11->bd;
  local_210 = (size_t)__return_storage_ptr__->nd;
  if (1 < local_210) {
    uVar9 = 1;
    do {
      if (__return_storage_ptr__->d[uVar9] != 1) goto LAB_0021f80e;
      uVar9 = uVar9 + 1;
    } while (local_210 != uVar9);
  }
  __return_storage_ptr__->nd = 1;
  local_210 = 1;
LAB_0021f80e:
  pDVar2 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pDVar11 != pDVar2) {
    uVar1 = __return_storage_ptr__->bd;
    uVar10 = 0;
    do {
      local_1f8 = *(undefined8 *)pDVar11->d;
      uVar3 = *(undefined8 *)(pDVar11->d + 6);
      uStack_1f0 = *(undefined8 *)(pDVar11->d + 2);
      uStack_1e8 = *(undefined8 *)(pDVar11->d + 4);
      uStack_1e0 = uVar3;
      uVar3 = uStack_1e0;
      local_1d8 = pDVar11->bd;
      uStack_1e0._4_4_ = (uint)((ulong)uVar3 >> 0x20);
      if (1 < (ulong)uStack_1e0._4_4_) {
        uVar9 = 1;
        do {
          uVar7 = uStack_1e0._4_4_;
          if (*(int *)((long)&local_1f8 + uVar9 * 4) != 1) goto LAB_0021f870;
          uVar9 = uVar9 + 1;
        } while (uStack_1e0._4_4_ != uVar9);
      }
      uVar7 = 1;
      uStack_1e0 = CONCAT44(1,(int)uVar3);
      uVar3 = uStack_1e0;
LAB_0021f870:
      uStack_1e0 = uVar3;
      uVar6 = (uint)local_1f8;
      if ((uint)local_1f8 == 0) goto LAB_0021f950;
      __return_storage_ptr__->d[0] = (uint)local_1f8;
      if (((uint)local_210 != uVar7) || (uVar1 != local_1d8)) {
LAB_0021f8d9:
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Bad input dimensions in Concatenate: ",0x25);
        operator<<((ostream *)local_1a8,xs);
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(this_00,local_1c8);
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      iVar8 = bcmp(__return_storage_ptr__,&local_1f8,local_210);
      if (iVar8 != 0) goto LAB_0021f8d9;
      uVar10 = uVar10 + uVar6;
      pDVar11 = pDVar11 + 1;
      __return_storage_ptr__->bd = uVar1;
    } while (pDVar11 != pDVar2);
    if (uVar10 != 0) {
      __return_storage_ptr__->d[0] = uVar10;
      return __return_storage_ptr__;
    }
  }
LAB_0021f950:
  __assert_fail("s > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/dim.h"
                ,0x44,"void cnn::Dim::set(unsigned int, unsigned int)");
}

Assistant:

Dim Concatenate::dim_forward(const vector<Dim>& xs) const {
  unsigned new_rows = 0;
  Dim dr = xs[0];
  if (LooksLikeVector(dr)) dr.resize(1);
  for (auto c : xs) {
    if (LooksLikeVector(c)) c.resize(1);
    new_rows += c[0];
    dr.set(0, c[0]);
    if (dr != c) {
      ostringstream s; s << "Bad input dimensions in Concatenate: " << xs;
      throw std::invalid_argument(s.str());
    }
    dr.bd = max(dr.bd, c.bd);
  }
  dr.set(0, new_rows);
  return dr;
}